

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexFilters.cpp
# Opt level: O3

void __thiscall
Ptex::v2_2::PtexBilinearFilter::buildKernel
          (PtexBilinearFilter *this,PtexSeparableKernel *k,float u,float v,float uw,float vw,
          Res faceRes)

{
  float *pfVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined4 in_XMM2_Db;
  undefined1 auVar10 [16];
  undefined1 in_register_000012c4 [12];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar9 [16];
  undefined1 auVar12 [16];
  
  auVar13._4_12_ = in_register_000012c4;
  auVar13._0_4_ = vw;
  auVar12._0_8_ = auVar13._0_8_;
  auVar12._8_4_ = in_register_000012c4._0_4_;
  auVar12._12_4_ = in_XMM2_Db;
  auVar11._8_8_ = auVar12._8_8_;
  auVar11._4_4_ = uw;
  auVar11._0_4_ = vw;
  auVar13 = minps(auVar11,_DAT_02edea50);
  auVar14._0_4_ = (float)(0x3f800000 - ((int)((uint)(byte)faceRes.vlog2 << 0x18) >> 1));
  auVar14._4_4_ = (float)(0x3f800000 - ((int)((uint)(ushort)faceRes << 0x18) >> 1));
  auVar14._8_8_ = 0;
  fVar5 = auVar13._4_4_;
  iVar3 = -(uint)(auVar14._0_4_ < auVar13._0_4_);
  iVar4 = -(uint)(auVar14._4_4_ < fVar5);
  auVar10._4_4_ = iVar4;
  auVar10._0_4_ = iVar3;
  auVar10._8_4_ = iVar4;
  auVar10._12_4_ = iVar4;
  auVar9._8_8_ = auVar10._8_8_;
  auVar9._4_4_ = iVar3;
  auVar9._0_4_ = iVar3;
  uVar2 = movmskpd((uint)(byte)faceRes.vlog2,auVar9);
  if ((uVar2 & 2) == 0) {
    fVar5 = auVar14._4_4_;
  }
  if ((uVar2 & 1) == 0) {
    auVar13 = auVar14;
  }
  uVar2 = 0x7f - ((uint)fVar5 >> 0x17);
  iVar3 = ((uVar2 & 0xff) - (auVar13._0_4_ >> 0xf & 0x1ff00)) + 0x7f00;
  k->res = SUB42(iVar3,0);
  fVar5 = u * (float)(1 << ((byte)uVar2 & 0x1f)) + -0.5;
  fVar8 = v * (float)(1 << ((byte)((uint)iVar3 >> 8) & 0x1f)) + -0.5;
  fVar6 = floorf(fVar5);
  fVar7 = floorf(fVar8);
  k->u = (int)fVar6;
  k->v = (int)fVar7;
  k->uw = 2;
  k->vw = 2;
  fVar5 = fVar5 - fVar6;
  fVar8 = fVar8 - fVar7;
  pfVar1 = k->ku;
  *pfVar1 = 1.0 - fVar5;
  pfVar1[1] = fVar5;
  pfVar1 = k->kv;
  *pfVar1 = 1.0 - fVar8;
  pfVar1[1] = fVar8;
  return;
}

Assistant:

virtual void buildKernel(PtexSeparableKernel& k, float u, float v, float uw, float vw,
                             Res faceRes)
    {
        // clamp filter width to no larger than 1.0
        uw = PtexUtils::min(uw, 1.0f);
        vw = PtexUtils::min(vw, 1.0f);

        // clamp filter width to no smaller than a texel
        uw = PtexUtils::max(uw, PtexUtils::reciprocalPow2(faceRes.ulog2));
        vw = PtexUtils::max(vw, PtexUtils::reciprocalPow2(faceRes.vlog2));

        uint8_t ureslog2 = (uint8_t)PtexUtils::calcResFromWidth(uw);
        uint8_t vreslog2 = (uint8_t)PtexUtils::calcResFromWidth(vw);
        Res res(ureslog2, vreslog2);
        k.res = res;

        // convert from normalized coords to pixel coords
        float upix = u * (float)k.res.u() - 0.5f;
        float vpix = v * (float)k.res.v() - 0.5f;

        float ufloor = PtexUtils::floor(upix);
        float vfloor = PtexUtils::floor(vpix);
        k.u = int(ufloor);
        k.v = int(vfloor);
        k.uw = 2;
        k.vw = 2;

        // compute kernel weights
        float ufrac = upix-ufloor, vfrac = vpix-vfloor;
        k.ku[0] = 1.0f - ufrac;
        k.ku[1] = ufrac;
        k.kv[0] = 1.0f - vfrac;
        k.kv[1] = vfrac;
    }